

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::Table(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,initializer_list<robin_hood::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit>_>
              initlist,size_t param_2,
       hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
       *h,equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *equal)

{
  this->mKeyVals = (Node *)&this->mMask;
  this->mInfo = (uint8_t *)&this->mMask;
  this->mMaxNumElementsAllowed = 0;
  this->mNumElements = 0;
  this->mMask = 0;
  this->mInfoInc = 0x20;
  this->mInfoHashShift = 0;
  Table<true,80ul,std::__cxx11::string,Rml::Unit,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::insert<robin_hood::pair<std::__cxx11::string,Rml::Unit>const*>
            ((Table<true,80ul,std::__cxx11::string,Rml::Unit,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              *)this,initlist._M_array,initlist._M_array + initlist._M_len);
  return;
}

Assistant:

Table(std::initializer_list<value_type> initlist,
          size_t ROBIN_HOOD_UNUSED(bucket_count) /*unused*/ = 0, const Hash& h = Hash{},
          const KeyEqual& equal = KeyEqual{})
        : WHash(h)
        , WKeyEqual(equal) {
        ROBIN_HOOD_TRACE(this)
        insert(initlist.begin(), initlist.end());
    }